

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall duckdb_re2::RE2::~RE2(RE2 *this)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  Regexp **ppRVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  void *pvVar4;
  string *psVar5;
  long lVar6;
  string *this_00;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar8;
  Regexp *pRVar9;
  string *psVar10;
  Regexp *in_RDI;
  Prog *in_stack_ffffffffffffff80;
  Regexp *pRVar11;
  
  pmVar1 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_RDI[3].field_5.submany_;
  pmVar7 = empty_group_names_abi_cxx11_();
  if ((pmVar1 != pmVar7) && (ppRVar2 = in_RDI[3].field_5.submany_, ppRVar2 != (Regexp **)0x0)) {
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x805ad4);
    operator_delete(ppRVar2);
  }
  pmVar3 = *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             **)(in_RDI + 3);
  pmVar8 = empty_named_groups_abi_cxx11_();
  if ((pmVar3 != pmVar8) && (pvVar4 = *(void **)(in_RDI + 3), pvVar4 != (void *)0x0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x805b27);
    operator_delete(pvVar4);
  }
  pvVar4 = in_RDI[2].arguments.the_union_[1];
  if (pvVar4 != (void *)0x0) {
    Prog::~Prog(in_stack_ffffffffffffff80);
    operator_delete(pvVar4);
  }
  pvVar4 = in_RDI[2].arguments.the_union_[0];
  if (pvVar4 != (void *)0x0) {
    Prog::~Prog(in_stack_ffffffffffffff80);
    operator_delete(pvVar4);
  }
  pRVar11 = in_RDI[1].down_;
  pRVar9 = (Regexp *)empty_string_abi_cxx11_();
  if ((pRVar11 != pRVar9) && (pRVar11 = in_RDI[1].down_, pRVar11 != (Regexp *)0x0)) {
    std::__cxx11::string::~string((string *)pRVar11);
    operator_delete(pRVar11);
  }
  psVar5 = (string *)in_RDI[1].field_5.submany_;
  psVar10 = empty_string_abi_cxx11_();
  if ((psVar5 != psVar10) && (pRVar11 = in_RDI[1].field_5.subone_, pRVar11 != (Regexp *)0x0)) {
    std::__cxx11::string::~string((string *)pRVar11);
    operator_delete(pRVar11);
  }
  lVar6._0_1_ = in_RDI[1].op_;
  lVar6._1_1_ = in_RDI[1].simple_;
  lVar6._2_2_ = in_RDI[1].parse_flags_;
  lVar6._4_2_ = in_RDI[1].ref_;
  lVar6._6_2_ = in_RDI[1].nsub_;
  if (lVar6 != 0) {
    Regexp::Decref(in_RDI);
  }
  if ((in_RDI->arguments).capture.name_ != (string *)0x0) {
    Regexp::Decref(in_RDI);
  }
  this_00 = *(string **)in_RDI;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)((long)&in_RDI[1].arguments + 8));
  return;
}

Assistant:

RE2::~RE2() {
  if (group_names_ != empty_group_names())
    delete group_names_;
  if (named_groups_ != empty_named_groups())
    delete named_groups_;
  delete rprog_;
  delete prog_;
  if (error_arg_ != empty_string())
    delete error_arg_;
  if (error_ != empty_string())
    delete error_;
  if (suffix_regexp_)
    suffix_regexp_->Decref();
  if (entire_regexp_)
    entire_regexp_->Decref();
  delete pattern_;
}